

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

void __thiscall
embree::SceneGraph::DistantLight::DistantLight
          (DistantLight *this,Vec3fa *D,Vec3fa *L,float halfAngle)

{
  undefined8 uVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Light *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  Light local_54;
  undefined8 *local_50;
  undefined8 *local_48;
  Light *local_38;
  Light *local_30;
  undefined8 *local_28;
  Light *local_20;
  undefined8 *local_18;
  Light *local_10;
  float local_4;
  
  local_54.type = (LightType)in_XMM0_Da;
  local_50 = in_RDX;
  local_48 = in_RSI;
  Light::Light(in_RDI,LIGHT_DISTANT);
  local_20 = in_RDI + 4;
  local_28 = local_48;
  uVar1 = local_48[1];
  *(undefined8 *)local_20 = *local_48;
  *(undefined8 *)(in_RDI + 6) = uVar1;
  local_10 = in_RDI + 8;
  local_18 = local_50;
  uVar1 = local_50[1];
  *(undefined8 *)local_10 = *local_50;
  *(undefined8 *)(in_RDI + 10) = uVar1;
  in_RDI[0xc].type = local_54.type;
  local_30 = &local_54;
  in_RDI[0xd].type = (LightType)((float)local_54.type * 0.017453292);
  local_38 = &local_54;
  local_4 = (float)local_54.type * 0.017453292;
  fVar2 = cosf(local_4);
  in_RDI[0xe].type = (LightType)fVar2;
  return;
}

Assistant:

DistantLight (const Vec3fa& D, const Vec3fa& L, const float halfAngle)
        : Light(LIGHT_DISTANT), D(D), L(L), halfAngle(halfAngle), radHalfAngle(deg2rad(halfAngle)), cosHalfAngle(cos(deg2rad(halfAngle))) {}